

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Composition.cpp
# Opt level: O1

void __thiscall Composition::Repair(Composition *this)

{
  (**this->_compositor->_vptr_Compositor)(this->_compositor);
  return;
}

Assistant:

void Composition::Repair() {
    Coord* natural;
    Coord* stretchability;
    Coord* shrinkability;
    int componentCount;
    int* breaks;

    // prepare the arrays with the desired component sizes
    // ...

    // determine where the breaks are:
    int breakCount;
    breakCount = _compositor->Compose(
        natural, stretchability, shrinkability,
        componentCount, _lineWidth, breaks
    );

    // lay out components according to breaks
    // ...
}